

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_column_data_scan.cpp
# Opt level: O2

unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>,_true> __thiscall
duckdb::PhysicalColumnDataScan::GetLocalSourceState
          (PhysicalColumnDataScan *this,ExecutionContext *param_1,GlobalSourceState *param_2)

{
  _func_int **in_RAX;
  
  make_uniq<duckdb::PhysicalColumnDataLocalScanState>();
  (this->super_PhysicalOperator)._vptr_PhysicalOperator = in_RAX;
  return (unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>_>)
         (unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>_>)this;
}

Assistant:

unique_ptr<LocalSourceState> PhysicalColumnDataScan::GetLocalSourceState(ExecutionContext &,
                                                                         GlobalSourceState &) const {
	return make_uniq<PhysicalColumnDataLocalScanState>();
}